

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

string * nite::subStr(string *__return_storage_ptr__,string *string,uint start,uint end)

{
  string *sub;
  uint i;
  allocator local_2a;
  allocator local_29;
  
  if ((ulong)start < string->_M_string_length) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_2a);
    for (; start <= end; start = start + 1) {
      std::__cxx11::string::at((ulong)string);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_29);
  }
  return __return_storage_ptr__;
}

Assistant:

String nite::subStr(const String &string, unsigned start, unsigned end){
    if (start<string.length() and start>=0){
        String sub = "";
        for (unsigned i=start; i<=end; i++){
            sub+=string.at(i);
        }
        return sub;
    }
    return "";
}